

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

string * __thiscall
slang::CommandLine::getHelpText_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view overview)

{
  long lVar1;
  pointer psVar2;
  pointer pcVar3;
  void *pvVar4;
  size_type __n;
  ulong uVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  element_type *peVar7;
  ulong uVar8;
  pointer psVar9;
  pointer ppVar10;
  void *__s;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string key;
  string indent;
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lines;
  string local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  string local_60;
  _Alloc_hider local_40;
  size_type local_38;
  
  local_98._0_8_ = overview._M_str;
  local_98._8_8_ = overview._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_98._8_8_ != 0) {
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_98;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0xe;
    ::fmt::v9::vformat_abi_cxx11_(&local_b8,(v9 *)"OVERVIEW: {}\n\n",fmt,args);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  local_98._0_8_ = (this->programName)._M_dataplus._M_p;
  local_98._8_8_ = (this->programName)._M_string_length;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)local_98;
  fmt_00.size_ = 0xd;
  fmt_00.data_ = (char *)0x13;
  ::fmt::v9::vformat_abi_cxx11_(&local_b8,(v9 *)"USAGE: {} [options]",fmt_00,args_00);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  peVar7 = (this->positional).
           super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar7 != (element_type *)0x0) {
    local_98._0_8_ = (peVar7->valueName)._M_dataplus._M_p;
    local_98._8_8_ = (peVar7->valueName)._M_string_length;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)local_98;
    fmt_01.size_ = 0xd;
    fmt_01.data_ = (char *)0x6;
    ::fmt::v9::vformat_abi_cxx11_(&local_b8,(v9 *)" {}...",fmt_01,args_01);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__,0x3f063d);
  local_78.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar9 = (this->orderedOptions).
           super__Vector_base<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->orderedOptions).
           super__Vector_base<std::shared_ptr<slang::CommandLine::Option>,_std::allocator<std::shared_ptr<slang::CommandLine::Option>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar9 == psVar2) {
    local_b8.field_2._M_allocated_capacity = 2;
  }
  else {
    uVar5 = 0;
    do {
      peVar7 = (psVar9->super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      pcVar3 = (peVar7->allArgNames)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar3,pcVar3 + (peVar7->allArgNames)._M_string_length);
      peVar7 = (psVar9->super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if ((peVar7->valueName)._M_string_length != 0) {
        pcVar6 = (peVar7->valueName)._M_dataplus._M_p;
        if (*pcVar6 != '=') {
          std::__cxx11::string::push_back((char)&local_b8);
          pcVar6 = (peVar7->valueName)._M_dataplus._M_p;
        }
        std::__cxx11::string::_M_append((char *)&local_b8,(ulong)pcVar6);
        peVar7 = (psVar9->super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
      }
      if (uVar5 <= local_b8._M_string_length) {
        uVar5 = local_b8._M_string_length;
      }
      local_98._0_8_ = peVar7;
      std::
      vector<std::pair<slang::CommandLine::Option*,std::__cxx11::string>,std::allocator<std::pair<slang::CommandLine::Option*,std::__cxx11::string>>>
      ::emplace_back<slang::CommandLine::Option*,std::__cxx11::string>
                ((vector<std::pair<slang::CommandLine::Option*,std::__cxx11::string>,std::allocator<std::pair<slang::CommandLine::Option*,std::__cxx11::string>>>
                  *)&local_78,(Option **)local_98,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar2);
    local_b8.field_2._M_allocated_capacity = uVar5 + 2;
  }
  local_b8._M_dataplus._M_p = " ";
  local_b8._M_string_length = 1;
  args_02.field_1.values_ = in_R9.values_;
  args_02.desc_ = (unsigned_long_long)&local_b8;
  fmt_02.size_ = 0x4d;
  fmt_02.data_ = (char *)0x7;
  local_38 = local_b8.field_2._M_allocated_capacity;
  ::fmt::v9::vformat_abi_cxx11_((string *)local_98,(v9 *)"  {:{}}",fmt_02,args_02);
  local_40._M_p =
       (pointer)local_78.
                super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  ppVar10 = local_78.
            super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_78.
      super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_b8._M_dataplus._M_p = *(pointer *)((long)ppVar10 + 8);
      local_b8._M_string_length = *(long *)((long)ppVar10 + 0x10);
      local_b8.field_2._M_allocated_capacity = local_38;
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)&local_b8;
      fmt_03.size_ = 0x4d;
      fmt_03.data_ = (char *)0x7;
      ::fmt::v9::vformat_abi_cxx11_(&local_60,(v9 *)"  {:{}}",fmt_03,args_03);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      uVar5 = *(ulong *)(*(long *)ppVar10 + 0x30);
      if (uVar5 != 0) {
        __s = *(void **)(*(long *)ppVar10 + 0x28);
        do {
          pvVar4 = memchr(__s,10,uVar5);
          if ((pvVar4 == (void *)0x0) ||
             (uVar8 = (long)pvVar4 - (long)__s, uVar8 == 0xffffffffffffffff)) break;
          lVar1 = uVar8 + 1;
          std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)__s);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_98._0_8_);
          if (uVar5 <= uVar8) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",lVar1,uVar5);
          }
          __s = (void *)((long)__s + lVar1);
          uVar5 = uVar5 - lVar1;
        } while (uVar5 != 0);
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)__s);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ppVar10 = (pointer)((long)ppVar10 + 0x28);
    } while (ppVar10 != (pointer)local_40._M_p);
  }
  if ((element_type *)local_98._0_8_ != (element_type *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
  }
  std::
  vector<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<slang::CommandLine::Option_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::getHelpText(string_view overview) const {
    std::string result;
    if (!overview.empty())
        result = fmt::format("OVERVIEW: {}\n\n"sv, overview);

    result += fmt::format("USAGE: {} [options]"sv, programName);
    if (positional)
        result += fmt::format(" {}...", positional->valueName);

    result += "\n\nOPTIONS:\n"sv;

    // For each option group that takes a value, tack on the value name.
    // Then compute the maximum length of any particular group's key.
    size_t maxLen = 0;
    std::vector<std::pair<Option*, std::string>> lines;
    for (auto& opt : orderedOptions) {
        std::string key = opt->allArgNames;
        std::string& val = opt->valueName;
        if (!val.empty()) {
            if (val[0] != '=')
                key += ' ';
            key += val;
        }

        maxLen = std::max(maxLen, key.length());
        lines.emplace_back(opt.get(), std::move(key));
    }

    // Add two spaces so that the description text is offset from the longest option name.
    maxLen += 2;

    // Finally append all groups to the output.
    std::string indent = fmt::format("  {:{}}"sv, " "sv, maxLen);
    for (auto& [opt, key] : lines) {
        result += fmt::format("  {:{}}"sv, key, maxLen);
        if (!opt->desc.empty()) {
            string_view desc = opt->desc;
            while (true) {
                size_t index = desc.find_first_of('\n');
                if (index == string_view::npos) {
                    result += desc;
                    break;
                }

                result += desc.substr(0, index + 1);
                result += indent;
                desc = desc.substr(index + 1);
            }
        }
        result += "\n";
    }

    return result;
}